

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::BeginFunctionBody
          (BinaryReaderObjdump *this,Index index,Offset size)

{
  ObjdumpState *pOVar1;
  pointer pbVar2;
  ulong uVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  
  uVar3 = (ulong)index;
  _Var5._M_p = (pointer)0x0;
  PrintDetails(this," - func[%u] size=%zd",uVar3,size);
  pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
  pbVar2 = (pOVar1->function_names).names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar4 = 0;
  if (uVar3 < (ulong)((long)(pOVar1->function_names).names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
    _Var5._M_p = pbVar2[uVar3]._M_dataplus._M_p;
    sVar4 = pbVar2[uVar3]._M_string_length;
  }
  if (sVar4 != 0) {
    PrintDetails(this," <%.*s>",sVar4,_Var5._M_p);
  }
  PrintDetails(this,"\n");
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::BeginFunctionBody(Index index, Offset size) {
  PrintDetails(" - func[%" PRIindex "] size=%" PRIzd, index, size);
  auto name = GetFunctionName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  return Result::Ok;
}